

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (RangeSelectSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  ASTContext *pAVar1;
  bool bVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  _Optional_payload_base<int> value;
  SyntaxNode *pSVar5;
  undefined4 extraout_var;
  Type *this;
  int *piVar6;
  Diagnostic *pDVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar8;
  SourceRange SVar9;
  SequenceRange SVar10;
  Diagnostic *diag;
  optional<unsigned_int> local_a0;
  SourceRange local_98;
  _Optional_payload_base<int> local_88;
  _Optional_payload_base<int> local_80;
  optional<int> r;
  Expression *re;
  _Optional_payload_base<int> local_60;
  bitmask<slang::ast::ASTFlags> flags;
  bitmask<slang::ast::ASTFlags> local_40;
  _Optional_payload_base<int> local_34;
  optional<int> l;
  bool allowUnbounded_local;
  ASTContext *context_local;
  RangeSelectSyntax *syntax_local;
  _Storage<unsigned_int,_true> _Stack_10;
  SequenceRange range;
  
  l.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_payload.
  _M_value._3_1_ = allowUnbounded;
  unique0x100003ab = context;
  SequenceRange((SequenceRange *)((long)&syntax_local + 4));
  pAVar1 = stack0xffffffffffffffd8;
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->left);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_40,AssertionDelayOrRepetition);
  value = (_Optional_payload_base<int>)ASTContext::evalInteger(pAVar1,pEVar4,local_40);
  pAVar1 = stack0xffffffffffffffd8;
  local_34 = value;
  pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::operator->(&syntax->left)->super_SyntaxNode
  ;
  _flags = slang::syntax::SyntaxNode::sourceRange(pSVar5);
  bVar2 = ASTContext::requirePositive(pAVar1,(optional<int>)value,_flags);
  if (bVar2) {
    piVar6 = std::optional<int>::operator*((optional<int> *)&local_34);
    syntax_local._4_4_ = *piVar6;
  }
  local_60 = (_Optional_payload_base<int>)ast::operator|(AssertionExpr,AssertionDelayOrRepetition);
  if ((l.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_payload._M_value._3_1_ & 1) != 0) {
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&re,AllowUnboundedLiteral);
    bitmask<slang::ast::ASTFlags>::operator|=
              ((bitmask<slang::ast::ASTFlags> *)&local_60,(bitmask<slang::ast::ASTFlags> *)&re);
  }
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->right);
  r.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)local_60;
  iVar3 = Expression::bind((int)pEVar4,(sockaddr *)stack0xffffffffffffffd8,
                           local_60._M_payload._M_value);
  this = not_null<const_slang::ast::Type_*>::operator->
                   (&((Expression *)CONCAT44(extraout_var,iVar3))->type);
  bVar2 = Type::isUnbounded(this);
  uVar8 = extraout_RDX;
  if (!bVar2) {
    local_88 = (_Optional_payload_base<int>)
               ASTContext::evalInteger
                         (stack0xffffffffffffffd8,(Expression *)CONCAT44(extraout_var,iVar3));
    pAVar1 = stack0xffffffffffffffd8;
    local_80 = local_88;
    pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::operator->(&syntax->right)->
              super_SyntaxNode;
    local_98 = slang::syntax::SyntaxNode::sourceRange(pSVar5);
    bVar2 = ASTContext::requirePositive(pAVar1,(optional<int>)local_88,local_98);
    uVar8 = extraout_RDX_00;
    if (bVar2) {
      piVar6 = std::optional<int>::operator*((optional<int> *)&local_80);
      diag._4_4_ = *piVar6;
      std::optional<unsigned_int>::optional<unsigned_int,_true>(&local_a0,(uint *)((long)&diag + 4))
      ;
      _Stack_10._M_value =
           local_a0.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      range.min = local_a0.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._4_4_;
      piVar6 = std::optional<int>::operator*((optional<int> *)&local_34);
      iVar3 = *piVar6;
      piVar6 = std::optional<int>::operator*((optional<int> *)&local_80);
      pAVar1 = stack0xffffffffffffffd8;
      uVar8 = extraout_RDX_01;
      if (*piVar6 < iVar3) {
        pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::operator->(&syntax->left)->
                  super_SyntaxNode;
        SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar5);
        pDVar7 = ASTContext::addDiag(pAVar1,(DiagCode)0x400008,SVar9);
        pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::operator->(&syntax->right)->
                  super_SyntaxNode;
        SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar5);
        Diagnostic::operator<<(pDVar7,SVar9);
        piVar6 = std::optional<int>::operator*((optional<int> *)&local_34);
        pDVar7 = Diagnostic::operator<<(pDVar7,*piVar6);
        piVar6 = std::optional<int>::operator*((optional<int> *)&local_80);
        Diagnostic::operator<<(pDVar7,*piVar6);
        uVar8 = extraout_RDX_02;
      }
    }
  }
  SVar10.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = _Stack_10._M_value;
  SVar10.min = syntax_local._4_4_;
  SVar10.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ =
       (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),(undefined1)range.min);
  return SVar10;
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const RangeSelectSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    SequenceRange range;
    auto l = context.evalInteger(*syntax.left, ASTFlags::AssertionDelayOrRepetition);
    if (context.requirePositive(l, syntax.left->sourceRange()))
        range.min = uint32_t(*l);

    // The rhs can be an unbounded '$' so we need extra AST flags.
    bitmask<ASTFlags> flags = ASTFlags::AssertionExpr | ASTFlags::AssertionDelayOrRepetition;
    if (allowUnbounded)
        flags |= ASTFlags::AllowUnboundedLiteral;

    auto& re = Expression::bind(*syntax.right, context, flags);
    if (re.type->isUnbounded())
        return range;

    auto r = context.evalInteger(re);
    if (context.requirePositive(r, syntax.right->sourceRange())) {
        range.max = uint32_t(*r);
        if (*l > *r) {
            auto& diag = context.addDiag(diag::SeqRangeMinMax, syntax.left->sourceRange());
            diag << syntax.right->sourceRange();
            diag << *l << *r;
        }
    }

    return range;
}